

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::MultiTexShader::makeSafeLods
          (MultiTexShader *this,
          vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *textureSizes,
          IVec2 *viewportSize)

{
  undefined8 uVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer pMVar4;
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  float *pfVar11;
  Mat4 *a;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar22;
  float fVar28;
  undefined1 auVar23 [16];
  float fVar21;
  float fVar29;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Mat4 shrinkScaleMat3d;
  Mat4 shrinkScaleMat2d;
  long local_158;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  Vector<float,_2> VStack_f0;
  Vector<float,_2> local_e8;
  float afStack_e0 [10];
  undefined1 local_b8 [16];
  float local_a8 [14];
  Mat4 local_70;
  
  pfVar6 = (float *)local_b8;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  local_b8._0_4_ = 0.0;
  local_b8._4_4_ = 0.0;
  local_b8._8_4_ = 0.0;
  local_b8._12_4_ = 0.0;
  local_a8[4] = 0.0;
  pfVar7 = makeSafeLods::shrinkScaleMat2dData;
  lVar8 = 0;
  do {
    lVar12 = 0;
    pfVar11 = pfVar6;
    do {
      *pfVar11 = pfVar7[lVar12];
      lVar12 = lVar12 + 1;
      pfVar11 = pfVar11 + 3;
    } while (lVar12 != 3);
    lVar8 = lVar8 + 1;
    pfVar6 = pfVar6 + 1;
    pfVar7 = pfVar7 + 3;
  } while (lVar8 != 3);
  matExtend3To4(&local_70,(Mat3 *)local_b8);
  pfVar6 = (float *)local_f8;
  local_e8.m_data[0] = 0.0;
  local_e8.m_data[1] = 0.0;
  afStack_e0[0] = 0.0;
  afStack_e0[1] = 0.0;
  local_f8._0_4_ = 0.0;
  local_f8._4_4_ = 0.0;
  VStack_f0.m_data[0] = 0.0;
  VStack_f0.m_data[1] = 0.0;
  afStack_e0[2] = 0.0;
  pfVar7 = makeSafeLods::shrinkScaleMat3dData;
  lVar8 = 0;
  do {
    lVar12 = 0;
    pfVar11 = pfVar6;
    do {
      *pfVar11 = pfVar7[lVar12];
      lVar12 = lVar12 + 1;
      pfVar11 = pfVar11 + 3;
    } while (lVar12 != 3);
    lVar8 = lVar8 + 1;
    pfVar6 = pfVar6 + 1;
    pfVar7 = pfVar7 + 3;
  } while (lVar8 != 3);
  matExtend3To4((Mat4 *)local_b8,(Mat3 *)local_f8);
  if (*(int *)&(this->super_ShaderProgram).field_0x154 < 1) {
    return;
  }
  auVar23._0_4_ = (float)(int)*(undefined8 *)viewportSize->m_data;
  auVar23._4_4_ = (float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20);
  auVar23._8_8_ = 0;
  auVar23 = divps(_DAT_01a1c5c0,auVar23);
  fVar20 = auVar23._0_4_;
  fVar28 = auVar23._4_4_;
  local_158 = 0;
  lVar8 = 0;
  do {
    while( true ) {
      pVVar2 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar3 = (textureSizes->
               super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      fVar18 = (float)pVVar3[lVar8].m_data[2];
      uVar1 = *(undefined8 *)pVVar3[lVar8].m_data;
      fVar21 = (float)(int)uVar1;
      fVar29 = (float)(int)((ulong)uVar1 >> 0x20);
      auVar30._0_4_ = pVVar2[lVar8].m_data[0].m_data[0] * fVar21 * fVar20;
      auVar30._4_4_ = pVVar2[lVar8].m_data[1].m_data[0] * fVar29 * fVar20;
      auVar30._8_4_ = fVar20 * 0.0;
      auVar30._12_4_ = fVar20 * 0.0;
      auVar35._0_4_ = pVVar2[lVar8].m_data[0].m_data[1] * fVar21 * fVar28;
      auVar35._4_4_ = pVVar2[lVar8].m_data[1].m_data[1] * fVar29 * fVar28;
      auVar35._8_4_ = fVar28 * 0.0;
      auVar35._12_4_ = fVar28 * 0.0;
      uVar5 = CONCAT44(auVar30._4_4_,auVar30._0_4_);
      auVar24._0_8_ = uVar5 ^ 0x8000000080000000;
      auVar24._8_4_ = -auVar30._8_4_;
      auVar24._12_4_ = -auVar30._12_4_;
      auVar25 = maxps(auVar24,auVar30);
      uVar5 = CONCAT44(auVar35._4_4_,auVar35._0_4_);
      auVar31._0_8_ = uVar5 ^ 0x8000000080000000;
      auVar31._8_4_ = -auVar35._8_4_;
      auVar31._12_4_ = -auVar35._12_4_;
      auVar32 = maxps(auVar31,auVar35);
      uVar15 = -(uint)(auVar32._0_4_ <= auVar25._0_4_);
      uVar17 = -(uint)(auVar32._4_4_ <= auVar25._4_4_);
      uVar1 = *(undefined8 *)pVVar2[lVar8].m_data[2].m_data;
      fStack_100 = auVar23._8_4_;
      fStack_fc = auVar23._12_4_;
      auVar27._0_4_ = fVar18 * (float)uVar1 * fVar20;
      auVar27._4_4_ = fVar18 * (float)((ulong)uVar1 >> 0x20) * fVar28;
      auVar27._8_4_ = fVar18 * 0.0 * fStack_100;
      auVar27._12_4_ = fVar18 * 0.0 * fStack_fc;
      uVar5 = CONCAT44(auVar27._4_4_,auVar27._0_4_);
      auVar26._0_8_ = uVar5 ^ 0x8000000080000000;
      auVar26._8_4_ = -auVar27._8_4_;
      auVar26._12_4_ = -auVar27._12_4_;
      auVar27 = maxps(auVar26,auVar27);
      uVar16 = -(uint)(auVar27._4_4_ <= auVar27._0_4_);
      fVar18 = logf((float)(~uVar17 & (uint)auVar32._4_4_ | (uint)auVar25._4_4_ & uVar17) +
                    (float)(~uVar15 & (uint)auVar32._0_4_ | (uint)auVar25._0_4_ & uVar15) +
                    (float)(~uVar16 & (uint)auVar27._4_4_ | (uint)auVar27._0_4_ & uVar16));
      fVar18 = fVar18 * 1.442695;
      pVVar2 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar3 = (textureSizes->
               super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      fVar21 = (float)pVVar3[lVar8].m_data[0];
      uVar1 = *(undefined8 *)pVVar2[lVar8].m_data[0].m_data;
      auVar32._0_4_ = fVar21 * (float)uVar1 * fVar20;
      auVar32._4_4_ = fVar21 * (float)((ulong)uVar1 >> 0x20) * fVar28;
      auVar32._8_4_ = fVar21 * 0.0 * fStack_100;
      auVar32._12_4_ = fVar21 * 0.0 * fStack_fc;
      uVar5 = CONCAT44(auVar32._4_4_,auVar32._0_4_);
      auVar33._0_8_ = uVar5 ^ 0x8000000080000000;
      auVar33._8_4_ = -auVar32._8_4_;
      auVar33._12_4_ = -auVar32._12_4_;
      auVar25 = maxps(auVar33,auVar32);
      uVar15 = -(uint)(auVar25._4_4_ <= auVar25._0_4_);
      fVar22 = (float)(~uVar15 & (uint)auVar25._4_4_ | (uint)auVar25._0_4_ & uVar15);
      uVar1 = *(undefined8 *)(pVVar3[lVar8].m_data + 1);
      fVar21 = (float)(int)uVar1;
      fVar29 = (float)(int)((ulong)uVar1 >> 0x20);
      auVar36._0_4_ = pVVar2[lVar8].m_data[1].m_data[0] * fVar21 * fVar20;
      auVar36._4_4_ = pVVar2[lVar8].m_data[2].m_data[0] * fVar29 * fVar20;
      auVar36._8_4_ = fVar20 * 0.0;
      auVar36._12_4_ = fVar20 * 0.0;
      fVar21 = pVVar2[lVar8].m_data[1].m_data[1] * fVar21 * fVar28;
      fVar29 = pVVar2[lVar8].m_data[2].m_data[1] * fVar29 * fVar28;
      uVar5 = CONCAT44(auVar36._4_4_,auVar36._0_4_);
      auVar19._0_8_ = uVar5 ^ 0x8000000080000000;
      auVar19._8_4_ = -auVar36._8_4_;
      auVar19._12_4_ = -auVar36._12_4_;
      auVar27 = maxps(auVar19,auVar36);
      auVar34._0_8_ = CONCAT44(fVar29,fVar21) ^ 0x8000000080000000;
      auVar34._8_4_ = -(fVar28 * 0.0);
      auVar34._12_4_ = -(fVar28 * 0.0);
      auVar25._4_4_ = fVar29;
      auVar25._0_4_ = fVar21;
      auVar25._8_4_ = fVar28 * 0.0;
      auVar25._12_4_ = fVar28 * 0.0;
      auVar25 = maxps(auVar34,auVar25);
      uVar15 = -(uint)(auVar25._0_4_ <= auVar27._0_4_);
      uVar16 = -(uint)(auVar25._4_4_ <= auVar27._4_4_);
      fVar21 = (float)(~uVar15 & (uint)auVar25._0_4_ | (uint)auVar27._0_4_ & uVar15);
      fVar29 = (float)(~uVar16 & (uint)auVar25._4_4_ | (uint)auVar27._4_4_ & uVar16);
      uVar15 = -(uint)(fVar29 <= fVar21);
      fVar21 = (float)(~uVar15 & (uint)fVar29 | (uint)fVar21 & uVar15);
      uVar15 = -(uint)(fVar21 <= fVar22);
      fVar21 = logf((float)(uVar15 & (uint)fVar22 | ~uVar15 & (uint)fVar21));
      iVar10 = 0;
      iVar14 = 0;
      if (0.5 <= fVar18 + 0.01) {
        fVar29 = ceilf(fVar18 + 0.01 + 0.5);
        iVar14 = (int)fVar29 + -1;
      }
      fVar21 = fVar21 * 1.442695;
      if (0.5 <= fVar21 + -0.01) {
        fVar29 = ceilf(fVar21 + -0.01 + 0.5);
        iVar10 = (int)fVar29 + -1;
      }
      fVar29 = -fVar18;
      if (-fVar18 <= fVar18) {
        fVar29 = fVar18;
      }
      if (0.1 <= fVar29) break;
LAB_01180a3b:
      a = &local_70;
      if ((this->m_unitTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar8] == 0x806f) {
        a = (Matrix<float,_4,_4> *)local_b8;
      }
      pfVar6 = (float *)local_f8;
      tcu::operator*((Matrix<float,_4,_4> *)pfVar6,a,
                     (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar8);
      pMVar4 = (this->m_transformations).
               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)(pMVar4->m_data).m_data[0].m_data + local_158;
      lVar9 = 0;
      do {
        lVar13 = 0;
        do {
          *(undefined4 *)(lVar12 + lVar13) = *(undefined4 *)((long)pfVar6 + lVar13);
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0x40);
        lVar9 = lVar9 + 1;
        lVar12 = lVar12 + 4;
        pfVar6 = pfVar6 + 1;
      } while (lVar9 != 4);
      calculateLodDerivateParts((Vector<tcu::Vector<float,_2>,_3> *)local_f8,pMVar4 + lVar8);
      pVVar2 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *&pVVar2[lVar8].m_data[2].m_data = local_e8.m_data;
      pVVar2 = pVVar2 + lVar8;
      *(undefined1 (*) [8])pVVar2->m_data[0].m_data = local_f8;
      *&pVVar2->m_data[1].m_data = VStack_f0.m_data;
    }
    if (0.0 < fVar18) {
      fVar29 = floorf(fVar18);
      fVar29 = (fVar18 - fVar29) + -0.5;
      fVar18 = -fVar29;
      if (-fVar29 <= fVar29) {
        fVar18 = fVar29;
      }
      if (fVar18 < 0.1) goto LAB_01180a3b;
    }
    fVar18 = -fVar21;
    if (-fVar21 <= fVar21) {
      fVar18 = fVar21;
    }
    if (fVar18 < 0.1) goto LAB_01180a3b;
    if (0.0 < fVar21) {
      fVar18 = floorf(fVar21);
      fVar21 = (fVar21 - fVar18) + -0.5;
      fVar18 = -fVar21;
      if (-fVar21 <= fVar21) {
        fVar18 = fVar21;
      }
      if (fVar18 < 0.1) goto LAB_01180a3b;
    }
    if (iVar14 != iVar10) goto LAB_01180a3b;
    lVar8 = lVar8 + 1;
    local_158 = local_158 + 0x40;
    if (*(int *)&(this->super_ShaderProgram).field_0x154 <= lVar8) {
      return;
    }
  } while( true );
}

Assistant:

void MultiTexShader::makeSafeLods (const vector<IVec3>& textureSizes, const IVec2& viewportSize)
{
	DE_ASSERT((int)textureSizes.size() == m_numUnits);

	static const float shrinkScaleMat2dData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	1.0f
	};
	static const float shrinkScaleMat3dData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	0.95f
	};
	Mat4 shrinkScaleMat2d = matExtend3To4(Mat3(shrinkScaleMat2dData));
	Mat4 shrinkScaleMat3d = matExtend3To4(Mat3(shrinkScaleMat3dData));

	Vec2 screenDerivate(1.0f / (float)viewportSize.x(), 1.0f / (float)viewportSize.y());

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		// As long as LOD is too close to 0.0 or is positive and too close to a something-and-a-half (0.5, 1.5, 2.5 etc) or allowed lod range could round to different levels, zoom in a little to get a safer LOD.
		for (;;)
		{
			const float threshold = 0.1f;
			const float epsilon	= 0.01f;

			const float lodMax = calculateLodMax(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);
			const float lodMin = calculateLodMin(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);

			const deInt32 maxLevel = (lodMax + epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMax + epsilon + 0.5f) - 1);
			const deInt32 minLevel = (lodMin - epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMin - epsilon + 0.5f) - 1);

			if (de::abs(lodMax) < threshold || (lodMax > 0.0f && de::abs(deFloatFrac(lodMax) - 0.5f) < threshold) ||
				de::abs(lodMin) < threshold || (lodMin > 0.0f && de::abs(deFloatFrac(lodMin) - 0.5f) < threshold) ||
				maxLevel != minLevel)
			{
				m_transformations[unitNdx] = (m_unitTypes[unitNdx] == GL_TEXTURE_3D ? shrinkScaleMat3d : shrinkScaleMat2d) * m_transformations[unitNdx];
				m_lodDerivateParts[unitNdx] = calculateLodDerivateParts(m_transformations[unitNdx]);
			}
			else
				break;
		}
	}
}